

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConditionalAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&,slang::ast::AssertionExpr_const*&>
          (BumpAllocator *this,Expression *args,AssertionExpr *args_1,AssertionExpr **args_2)

{
  ConditionalAssertionExpr *elseExpr;
  AssertionExpr *in_RCX;
  Expression *in_RDX;
  ConditionalAssertionExpr *in_RSI;
  BumpAllocator *in_RDI;
  
  elseExpr = (ConditionalAssertionExpr *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  ast::ConditionalAssertionExpr::ConditionalAssertionExpr
            (in_RSI,in_RDX,in_RCX,(AssertionExpr *)elseExpr);
  return elseExpr;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }